

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cpp_properties::latin1_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cpp_properties *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *latin1_string)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = *(char **)(this + 8);
  for (pcVar2 = *(char **)this; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    encode_latin1_to_utf8<char>(*pcVar2,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> latin1_to_utf8(const boost::iterator_range<ForwardTraversalIterator> &latin1_string) {
  std::basic_string<CharT> utf8;

  for (auto code_point : latin1_string) {
    encode_latin1_to_utf8(code_point, utf8);
  }

  return utf8;
}